

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsPseudocost.h
# Opt level: O1

void __thiscall HighsPseudocost::increaseConflictWeight(HighsPseudocost *this)

{
  pointer pdVar1;
  pointer pdVar2;
  uint uVar3;
  ulong uVar4;
  double dVar5;
  
  dVar5 = this->conflict_weight * 1.02;
  this->conflict_weight = dVar5;
  if (1000.0 < dVar5) {
    dVar5 = 1.0 / dVar5;
    this->conflict_weight = 1.0;
    this->conflict_avg_score = this->conflict_avg_score * dVar5;
    pdVar1 = (this->conflictscoreup).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar3 = (uint)((ulong)((long)(this->conflictscoreup).
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_finish - (long)pdVar1) >> 3);
    if (0 < (int)uVar3) {
      pdVar2 = (this->conflictscoredown).super__Vector_base<double,_std::allocator<double>_>._M_impl
               .super__Vector_impl_data._M_start;
      uVar4 = 0;
      do {
        pdVar1[uVar4] = pdVar1[uVar4] * dVar5;
        pdVar2[uVar4] = pdVar2[uVar4] * dVar5;
        uVar4 = uVar4 + 1;
      } while ((uVar3 & 0x7fffffff) != uVar4);
    }
  }
  return;
}

Assistant:

void increaseConflictWeight() {
    conflict_weight *= 1.02;

    if (conflict_weight > 1000.0) {
      double scale = 1.0 / conflict_weight;
      conflict_weight = 1.0;
      conflict_avg_score *= scale;

      HighsInt numCol = conflictscoreup.size();
      for (HighsInt i = 0; i < numCol; ++i) {
        conflictscoreup[i] *= scale;
        conflictscoredown[i] *= scale;
      }
    }
  }